

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_test.cc
# Opt level: O0

vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
* (anonymous_namespace)::
  GetLowbdLumaTestParams<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,int,ConvolveParams*)>
            (_func_void_uchar_ptr_int_uchar_ptr_int_int_int_InterpFilterParams_ptr_int_ConvolveParams_ptr
             *test_func)

{
  vector<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>,_std::allocator<(anonymous_namespace)::TestParam<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_InterpFilterParams_*,_int,_ConvolveParams_*)>_>_>
  *in_RDI;
  _func_void_uchar_ptr_int_uchar_ptr_int_int_int_InterpFilterParams_ptr_int_ConvolveParams_ptr
  *in_stack_000000a8;
  undefined1 in_stack_000000b0 [16];
  undefined4 local_24;
  undefined4 *local_20;
  undefined8 local_18;
  
  local_24 = 8;
  local_20 = &local_24;
  local_18 = 1;
  GetLumaTestParams<void(*)(unsigned_char_const*,int,unsigned_char*,int,int,int,InterpFilterParams_const*,int,ConvolveParams*)>
            ((initializer_list<int>)in_stack_000000b0,in_stack_000000a8);
  return in_RDI;
}

Assistant:

std::vector<TestParam<T>> GetLowbdLumaTestParams(T test_func) {
  return GetLumaTestParams({ 8 }, test_func);
}